

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_1d643::test_too_small_output_buffer(void)

{
  bool condition;
  jpegls_decoder *this;
  error_code local_110;
  jpegls_error *e;
  error_code error;
  undefined1 local_e0 [8];
  jpegls_decoder decoder;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> destination;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded;
  
  read_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            &destination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            "test/tulips-gray-8bit-512-512-hp-encoder.jls",0,0);
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x3fe00,&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  charls::jpegls_decoder::jpegls_decoder((jpegls_decoder *)local_e0);
  this = charls::jpegls_decoder::
         source<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
                   ((jpegls_decoder *)local_e0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &destination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  charls::jpegls_decoder::read_header(this);
  std::error_code::error_code((error_code *)&e);
  charls::jpegls_decoder::
  decode<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
            ((jpegls_decoder *)local_e0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  std::error_code::error_code<charls::jpegls_errc,void>(&local_110,UncompressedBufferTooSmall);
  condition = std::operator==((error_code *)&e,&local_110);
  assert::is_true(condition);
  charls::jpegls_decoder::~jpegls_decoder((jpegls_decoder *)local_e0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &destination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void test_too_small_output_buffer()
{
    const vector<uint8_t> encoded{read_file("test/tulips-gray-8bit-512-512-hp-encoder.jls")};
    vector<uint8_t> destination(size_t{512} * 511);

    jpegls_decoder decoder;
    decoder.source(encoded).read_header();

    error_code error;
    try
    {
        decoder.decode(destination);
    }
    catch (const jpegls_error& e)
    {
        error = e.code();
    }

    assert::is_true(error == jpegls_errc::destination_buffer_too_small);
}